

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::ReplicatedAssignmentPatternSyntax::ReplicatedAssignmentPatternSyntax
          (ReplicatedAssignmentPatternSyntax *this,Token openBrace,ExpressionSyntax *countExpr,
          Token innerOpenBrace,SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *items,
          Token innerCloseBrace,Token closeBrace)

{
  Token TVar1;
  Token TVar2;
  bool bVar3;
  ExpressionSyntax *pEVar4;
  ExpressionSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *local_38;
  ExpressionSyntax *countExpr_local;
  ReplicatedAssignmentPatternSyntax *this_local;
  Token innerOpenBrace_local;
  Token openBrace_local;
  
  TVar2 = closeBrace;
  TVar1 = innerCloseBrace;
  innerOpenBrace_local._0_8_ = innerOpenBrace.info;
  this_local = innerOpenBrace._0_8_;
  innerOpenBrace_local.info = openBrace._0_8_;
  local_38 = (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)countExpr;
  countExpr_local = (ExpressionSyntax *)this;
  AssignmentPatternSyntax::AssignmentPatternSyntax
            (&this->super_AssignmentPatternSyntax,ReplicatedAssignmentPattern);
  *(Info **)&this->openBrace = innerOpenBrace_local.info;
  (this->openBrace).info = openBrace.info;
  __range2 = local_38;
  not_null<slang::syntax::ExpressionSyntax*>::not_null<slang::syntax::ExpressionSyntax*,void>
            ((not_null<slang::syntax::ExpressionSyntax*> *)&this->countExpr,
             (ExpressionSyntax **)&__range2);
  *(ReplicatedAssignmentPatternSyntax **)&this->innerOpenBrace = this_local;
  (this->innerOpenBrace).info = (Info *)innerOpenBrace_local._0_8_;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::SeparatedSyntaxList(&this->items,items);
  (this->innerCloseBrace).kind = innerCloseBrace.kind;
  (this->innerCloseBrace).field_0x2 = innerCloseBrace._2_1_;
  (this->innerCloseBrace).numFlags = (NumericTokenFlags)innerCloseBrace.numFlags.raw;
  (this->innerCloseBrace).rawLen = innerCloseBrace.rawLen;
  innerCloseBrace.info = TVar1.info;
  (this->innerCloseBrace).info = innerCloseBrace.info;
  (this->closeBrace).kind = closeBrace.kind;
  (this->closeBrace).field_0x2 = closeBrace._2_1_;
  (this->closeBrace).numFlags = (NumericTokenFlags)closeBrace.numFlags.raw;
  (this->closeBrace).rawLen = closeBrace.rawLen;
  closeBrace.info = TVar2.info;
  (this->closeBrace).info = closeBrace.info;
  pEVar4 = not_null<slang::syntax::ExpressionSyntax_*>::operator->(&this->countExpr);
  (pEVar4->super_SyntaxNode).parent = (SyntaxNode *)this;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  join_0x00000010_0x00000000_ =
       SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::begin(&this->items);
  _child = SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::end(&this->items);
  while( true ) {
    bVar3 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ExpressionSyntax_*,_unsigned_long,_slang::syntax::ExpressionSyntax_**,_slang::syntax::ExpressionSyntax_*&>
            ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ExpressionSyntax_*,_unsigned_long,_slang::syntax::ExpressionSyntax_**,_slang::syntax::ExpressionSyntax_*&>
                          *)&__end2.index,(iterator_base<slang::syntax::ExpressionSyntax_*> *)&child
                        );
    if (!bVar3) break;
    pEVar4 = SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::
             iterator_base<slang::syntax::ExpressionSyntax_*>::operator*
                       ((iterator_base<slang::syntax::ExpressionSyntax_*> *)&__end2.index);
    (pEVar4->super_SyntaxNode).parent = (SyntaxNode *)this;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ExpressionSyntax_*,_unsigned_long,_slang::syntax::ExpressionSyntax_**,_slang::syntax::ExpressionSyntax_*&>
    ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ExpressionSyntax_*,_unsigned_long,_slang::syntax::ExpressionSyntax_**,_slang::syntax::ExpressionSyntax_*&>
                  *)&__end2.index);
  }
  return;
}

Assistant:

ReplicatedAssignmentPatternSyntax(Token openBrace, ExpressionSyntax& countExpr, Token innerOpenBrace, const SeparatedSyntaxList<ExpressionSyntax>& items, Token innerCloseBrace, Token closeBrace) :
        AssignmentPatternSyntax(SyntaxKind::ReplicatedAssignmentPattern), openBrace(openBrace), countExpr(&countExpr), innerOpenBrace(innerOpenBrace), items(items), innerCloseBrace(innerCloseBrace), closeBrace(closeBrace) {
        this->countExpr->parent = this;
        this->items.parent = this;
        for (auto child : this->items)
            child->parent = this;
    }